

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::SpecparamSymbol::serializeTo(SpecparamSymbol *this,ASTSerializer *serializer)

{
  bool bVar1;
  ConstantValue *__n;
  string_view name;
  string_view name_00;
  
  ASTSerializer::write(serializer,0xb,"isPathPulse",(ulong)this->isPathPulse);
  bVar1 = this->isPathPulse;
  __n = getValue(this,(SourceRange)ZEXT816(0));
  if (bVar1 != true) {
    ASTSerializer::write(serializer,5,"value",(size_t)__n);
    return;
  }
  ASTSerializer::write(serializer,0xb,"rejectLimit",(size_t)this->value1);
  getValue(this,(SourceRange)ZEXT816(0));
  ASTSerializer::write(serializer,10,"errorLimit",(size_t)this->value2);
  if (this->pathPulseResolved == false) {
    resolvePathPulse(this);
  }
  if (this->pathSource != (Symbol *)0x0) {
    name._M_str = "pathSource";
    name._M_len = 10;
    ASTSerializer::writeLink(serializer,name,this->pathSource);
  }
  if (this->pathPulseResolved == false) {
    resolvePathPulse(this);
  }
  if (this->pathDest != (Symbol *)0x0) {
    name_00._M_str = "pathDest";
    name_00._M_len = 8;
    ASTSerializer::writeLink(serializer,name_00,this->pathDest);
    return;
  }
  return;
}

Assistant:

void SpecparamSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("isPathPulse", isPathPulse);
    if (isPathPulse) {
        serializer.write("rejectLimit", getPulseRejectLimit());
        serializer.write("errorLimit", getPulseErrorLimit());
        if (auto symbol = getPathSource())
            serializer.writeLink("pathSource", *symbol);
        if (auto symbol = getPathDest())
            serializer.writeLink("pathDest", *symbol);
    }
    else {
        serializer.write("value", getValue());
    }
}